

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O0

Vec_Int_t * Rnm_ManFilterSelected(Rnm_Man_t *p,Vec_Int_t *vOldPPis)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  undefined1 local_58 [8];
  int Counters [3];
  int RetValue;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFanins;
  Vec_Int_t *vNewPPis;
  int fVerbose;
  Vec_Int_t *vOldPPis_local;
  Rnm_Man_t *p_local;
  
  memset(local_58,0,0xc);
  Vec_IntClear(p->vFanins);
  RetValue = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vOldPPis);
    bVar6 = false;
    if (RetValue < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(vOldPPis,RetValue);
      pFanin = Gia_ManObj(pGVar1,iVar2);
      bVar6 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pVVar4 = Ga2_ObjLeaves(p->pGia,pFanin);
    Counters[2] = 0;
    while( true ) {
      iVar2 = Counters[2];
      iVar3 = Vec_IntSize(pVVar4);
      bVar6 = false;
      if (iVar2 < iVar3) {
        pGVar1 = p->pGia;
        iVar2 = Vec_IntEntry(pVVar4,Counters[2]);
        _k = Gia_ManObj(pGVar1,iVar2);
        bVar6 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Rnm_ObjAddToCount(p,_k);
      if (iVar2 == 0) {
        pVVar5 = p->vFanins;
        iVar2 = Gia_ObjId(p->pGia,_k);
        Vec_IntPush(pVVar5,iVar2);
      }
      Counters[2] = Counters[2] + 1;
    }
    RetValue = RetValue + 1;
  }
  pVVar4 = Vec_IntAlloc(100);
  RetValue = 0;
  do {
    iVar2 = Vec_IntSize(vOldPPis);
    bVar6 = false;
    if (RetValue < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(vOldPPis,RetValue);
      pFanin = Gia_ManObj(pGVar1,iVar2);
      bVar6 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      Counters[1] = Vec_IntUniqify(pVVar4);
      if (Counters[1] != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRefSelect.c"
                      ,0xb2,"Vec_Int_t *Rnm_ManFilterSelected(Rnm_Man_t *, Vec_Int_t *)");
      }
      RetValue = 0;
      Counters[1] = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vFanins);
        bVar6 = false;
        if (RetValue < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(p->vFanins,RetValue);
          pFanin = Gia_ManObj(pGVar1,iVar2);
          bVar6 = pFanin != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        Rnm_ObjSetCount(p,pFanin,0);
        RetValue = RetValue + 1;
      }
      return pVVar4;
    }
    iVar2 = Gia_ObjIsRo(p->pGia,pFanin);
    if (iVar2 == 0) {
      pVVar5 = Ga2_ObjLeaves(p->pGia,pFanin);
      Counters[2] = 0;
      while( true ) {
        iVar2 = Counters[2];
        iVar3 = Vec_IntSize(pVVar5);
        bVar6 = false;
        if (iVar2 < iVar3) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(pVVar5,Counters[2]);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) goto LAB_00717cbe;
        iVar2 = Rnm_ObjIsJust(p,_k);
        if ((iVar2 != 0) || (iVar2 = Rnm_ObjCount(p,_k), 1 < iVar2)) break;
        Counters[2] = Counters[2] + 1;
      }
      iVar2 = Gia_ObjId(p->pGia,pFanin);
      Vec_IntPush(pVVar4,iVar2);
    }
    else {
      iVar2 = Gia_ObjId(p->pGia,pFanin);
      Vec_IntPush(pVVar4,iVar2);
    }
LAB_00717cbe:
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Rnm_ManFilterSelected( Rnm_Man_t * p, Vec_Int_t * vOldPPis )
{
    int fVerbose = 0;
    Vec_Int_t * vNewPPis, * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, RetValue, Counters[3] = {0};

    // (0) make sure fanin counters are 0 at the beginning
//    Gia_ManForEachObj( p->pGia, pObj, i )
//        assert( Rnm_ObjCount(p, pObj) == 0 );

    // (1) increment PPI fanin counters
    Vec_IntClear( p->vFanins );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
            if ( Rnm_ObjAddToCount(p, pFanin) == 0 ) // fanin counter is 0 -- save it
                Vec_IntPush( p->vFanins, Gia_ObjId(p->pGia, pFanin) );
    }

    // (3) select objects with reconvergence, which create potential constraints
    // - flop objects
    // - objects whose fanin belongs to the justified area
    // - objects whose fanins overlap
    // (these do not guantee reconvergence, but may potentially have it)
    // (other objects cannot have reconvergence, even if they are added)
    vNewPPis = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( fVerbose )
                Counters[0]++;
            Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
            continue;
        }
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
        {
            if ( Rnm_ObjIsJust(p, pFanin) || Rnm_ObjCount(p, pFanin) > 1 )
            {
                if ( fVerbose )
                    Counters[1] += Rnm_ObjIsJust(p, pFanin);
                if ( fVerbose )
                    Counters[2] += (Rnm_ObjCount(p, pFanin) > 1);
                Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
                break;
            }
        }
    }
    RetValue = Vec_IntUniqify( vNewPPis );
    assert( RetValue == 0 );

    // (4) clear fanin counters
    // this is important for counters to be correctly set in the future iterations -- see step (0)
    Gia_ManForEachObjVec( p->vFanins, p->pGia, pObj, i )
        Rnm_ObjSetCount( p, pObj, 0 );

    // visualize
    if ( fVerbose )
        printf( "*** Refinement %3d : PI+PPI =%4d. Old =%4d. New =%4d.   FF =%4d. Just =%4d. Shared =%4d.\n", 
            p->nRefId, Vec_IntSize(p->vMap), Vec_IntSize(vOldPPis), Vec_IntSize(vNewPPis), Counters[0], Counters[1], Counters[2] );

//    Rnm_ManPrintSelected( p, vNewPPis );
//    Ga2_StructAnalize( p->pGia, p->vMap, p->vObjs, vNewPPis );
    return vNewPPis;
}